

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O3

string * units::getCommodityName_abi_cxx11_(uint32_t commodity)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  iterator iVar9;
  const_iterator cVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  uint in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 uVar14;
  string __str;
  uint local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_8c = in_ESI;
  if ((((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
      (customCommodityNames_abi_cxx11_._24_8_ != 0)) &&
     (iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)customCommodityNames_abi_cxx11_,&local_8c),
     iVar9.
     super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
     ._M_cur != (__node_type *)0x0)) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    return (string *)in_RDI;
  }
  cVar10 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)commodities::commodity_names,&local_8c);
  if (cVar10.super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>._M_cur !=
      (__node_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,
               *(char **)((long)cVar10.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>
                                ._M_cur + 0x10),(allocator<char> *)&local_88);
    return (string *)in_RDI;
  }
  if ((local_8c & 0x7c000000) == 0x40000000) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,((byte)local_8c & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,((byte)(local_8c >> 5) & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,((byte)(local_8c >> 10) & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,((byte)(local_8c >> 0xf) & 0x1f) + 0x5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,((byte)(local_8c >> 0x14) & 0x1f) + 0x5f);
    while( true ) {
      if (in_RDI->_M_string_length == 0) {
        return (string *)in_RDI;
      }
      if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] != '_') break;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (in_RDI);
    }
    return (string *)in_RDI;
  }
  paVar2 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CXCOMM[","");
  uVar8 = 1;
  if (9 < local_8c) {
    uVar7 = 4;
    uVar13 = local_8c;
    do {
      uVar8 = uVar7;
      if (uVar13 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_003f1cdd;
      }
      if (uVar13 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_003f1cdd;
      }
      if (uVar13 < 10000) goto LAB_003f1cdd;
      bVar6 = 99999 < uVar13;
      uVar7 = uVar8 + 4;
      uVar13 = uVar13 / 10000;
    } while (bVar6);
    uVar8 = uVar8 + 1;
  }
LAB_003f1cdd:
  paVar3 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar3;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_68,(ulong)uVar8,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_68._M_dataplus._M_p,(uint)local_68._M_string_length,local_8c);
  uVar1 = CONCAT44(local_68._M_string_length._4_4_,(uint)local_68._M_string_length) +
          local_48._M_string_length;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    uVar14 = local_48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar1) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar3) {
      uVar14 = local_68.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar14) {
      pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::replace(&local_68,0,0,local_48._M_dataplus._M_p,local_48._M_string_length);
      goto LAB_003f1d5f;
    }
  }
  pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_48,local_68._M_dataplus._M_p,
                      CONCAT44(local_68._M_string_length._4_4_,(uint)local_68._M_string_length));
LAB_003f1d5f:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar11->_M_dataplus)._M_p;
  paVar12 = &pbVar11->field_2;
  if (paVar4 == paVar12) {
    local_88.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_88._M_dataplus._M_p = (pointer)paVar4;
  }
  local_88._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar11->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
  pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(&local_88,"]");
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar5 = (pbVar11->_M_dataplus)._M_p;
  paVar12 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar12) {
    uVar14 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar14;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar5;
    (in_RDI->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (string *)in_RDI;
}

Assistant:

std::string getCommodityName(std::uint32_t commodity)
{
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityNames.empty()) {
            auto fnd2 = customCommodityNames.find(commodity);
            if (fnd2 != customCommodityNames.end()) {
                return fnd2->second;
            }
        }
    }
    auto fnd = commodities::commodity_names.find(commodity);
    if (fnd != commodities::commodity_names.end()) {
        return fnd->second;
    }

    if ((commodity & 0x7C000000U) == 0x40000000U) {
        std::string ret;
        ret.push_back((commodity & 0X1FU) + '_');
        ret.push_back(((commodity >> 5U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 10U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 15U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 20U) & 0X1FU) + '_');
        while (!ret.empty() && ret.back() == '_') {
            ret.pop_back();
        }
        return ret;
    }
    return std::string("CXCOMM[") + std::to_string(commodity) + "]";
}